

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O1

void __thiscall antlr::BitSet::add(BitSet *this,uint el)

{
  ulong *puVar1;
  
  if ((ulong)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= (ulong)el) {
    std::vector<bool,_std::allocator<bool>_>::resize(&this->storage,(ulong)(el + 1),false);
  }
  puVar1 = (ulong *)((long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                    (ulong)(el >> 6) * 8);
  *puVar1 = *puVar1 | 1L << ((byte)el & 0x3f);
  return;
}

Assistant:

void BitSet::add(unsigned int el)
{
	if( el >= storage.size() )
		storage.resize( el+1, false );

	storage[el] = true;
}